

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statusor_internal.h
# Opt level: O1

void __thiscall
absl::lts_20240722::internal_statusor::StatusOrData<int>::~StatusOrData(StatusOrData<int> *this)

{
  if (((ulong)this->field_0 & 1) == 0) {
    absl::lts_20240722::status_internal::StatusRep::Unref();
  }
  return;
}

Assistant:

~StatusOrData() {
    if (ok()) {
      status_.~Status();
      data_.~T();
    } else {
      status_.~Status();
    }
  }